

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_2d_facade
               (uint8_t *src8,int src_stride,uint8_t *dst8,int dst_stride,int w,int h,
               InterpFilterParams **interp_filters,int subpel_x_qn,int x_step_q4,int subpel_y_qn,
               int y_step_q4,int scaled,ConvolveParams *conv_params,int bd)

{
  InterpFilterParams *pIVar1;
  InterpFilterParams *pIVar2;
  uint16_t *src;
  uint16_t *dst;
  ConvolveParams *pCVar3;
  _func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr_int
  **pp_Var4;
  _func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_ConvolveParams_ptr_int
  **pp_Var5;
  InterpFilterParams *in_stack_ffffffffffffff88;
  InterpFilterParams *in_stack_ffffffffffffff90;
  InterpFilterParams *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb0;
  
  pCVar3 = (ConvolveParams *)(ulong)(uint)bd;
  src = (uint16_t *)((long)src8 * 2);
  pIVar1 = *interp_filters;
  pIVar2 = interp_filters[1];
  dst = (uint16_t *)((long)dst8 * 2);
  if ((pIVar1->taps == 2) || (pIVar2->taps == 2)) {
    if (subpel_y_qn != 0 && subpel_x_qn != 0) {
      av1_highbd_convolve_2d_sr_intrabc_c
                (src,src_stride,dst,dst_stride,w,h,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff90,(int)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                 conv_params,bd);
      return;
    }
    if (subpel_x_qn != 0) {
      av1_highbd_convolve_x_sr_intrabc_c
                (src,src_stride,dst,dst_stride,w,h,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffffa0,conv_params,bd);
      return;
    }
    if (subpel_y_qn != 0) {
      av1_highbd_convolve_y_sr_intrabc_c
                (src,src_stride,dst,dst_stride,w,h,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffffa0,bd);
      return;
    }
  }
  if (scaled != 0) {
    (*av1_highbd_convolve_2d_scale)
              (src,src_stride,dst,dst_stride,w,h,pIVar1,pIVar2,subpel_x_qn,x_step_q4,subpel_y_qn,
               y_step_q4,conv_params,bd);
    return;
  }
  if (conv_params->is_compound == 0) {
    if (subpel_x_qn == 0 && subpel_y_qn == 0) {
      (*aom_highbd_convolve_copy)(src,(long)src_stride,dst,(long)dst_stride,w,h);
      return;
    }
    if (subpel_x_qn == 0 || subpel_y_qn != 0) {
      if (subpel_x_qn == 0 && subpel_y_qn != 0) {
        pp_Var4 = (_func_void_uint16_t_ptr_int_uint16_t_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr_int
                   **)&av1_highbd_convolve_y_sr;
        bd = in_stack_ffffffffffffffb0;
        goto LAB_009ad057;
      }
      pp_Var5 = &av1_highbd_convolve_2d_sr;
      goto LAB_009ad024;
    }
    pp_Var4 = &av1_highbd_convolve_x_sr;
  }
  else {
    if (subpel_x_qn == 0 && subpel_y_qn == 0) {
      (*av1_highbd_dist_wtd_convolve_2d_copy)(src,src_stride,dst,dst_stride,w,h,conv_params,bd);
      return;
    }
    if (subpel_x_qn == 0 || subpel_y_qn != 0) {
      if (subpel_x_qn == 0 && subpel_y_qn != 0) {
        pp_Var4 = &av1_highbd_dist_wtd_convolve_y;
        pCVar3 = conv_params;
LAB_009ad057:
        (**pp_Var4)(src,src_stride,dst,dst_stride,w,h,pIVar2,subpel_y_qn,pCVar3,bd);
        return;
      }
      pp_Var5 = &av1_highbd_dist_wtd_convolve_2d;
LAB_009ad024:
      (**pp_Var5)(src,src_stride,dst,dst_stride,w,h,pIVar1,pIVar2,subpel_x_qn,subpel_y_qn,
                  conv_params,bd);
      return;
    }
    pp_Var4 = &av1_highbd_dist_wtd_convolve_x;
  }
  (**pp_Var4)(src,src_stride,dst,dst_stride,w,h,pIVar1,subpel_x_qn,conv_params,bd);
  return;
}

Assistant:

void av1_highbd_convolve_2d_facade(const uint8_t *src8, int src_stride,
                                   uint8_t *dst8, int dst_stride, int w, int h,
                                   const InterpFilterParams *interp_filters[2],
                                   const int subpel_x_qn, int x_step_q4,
                                   const int subpel_y_qn, int y_step_q4,
                                   int scaled, ConvolveParams *conv_params,
                                   int bd) {
  (void)x_step_q4;
  (void)y_step_q4;
  (void)dst_stride;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);

  const InterpFilterParams *filter_params_x = interp_filters[0];
  const InterpFilterParams *filter_params_y = interp_filters[1];

  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  // 2-tap filter indicates that it is for IntraBC.
  if (filter_params_x->taps == 2 || filter_params_y->taps == 2) {
    assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
    assert(!scaled);
    if (subpel_x_qn && subpel_y_qn) {
      av1_highbd_convolve_2d_sr_intrabc_c(
          src, src_stride, dst, dst_stride, w, h, filter_params_x,
          filter_params_y, subpel_x_qn, subpel_y_qn, conv_params, bd);
      return;
    } else if (subpel_x_qn) {
      av1_highbd_convolve_x_sr_intrabc_c(src, src_stride, dst, dst_stride, w, h,
                                         filter_params_x, subpel_x_qn,
                                         conv_params, bd);
      return;
    } else if (subpel_y_qn) {
      av1_highbd_convolve_y_sr_intrabc_c(src, src_stride, dst, dst_stride, w, h,
                                         filter_params_y, subpel_y_qn, bd);
      return;
    }
  }

  if (scaled) {
    if (conv_params->is_compound) {
      assert(conv_params->dst != NULL);
    }
    av1_highbd_convolve_2d_scale(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, filter_params_y, subpel_x_qn,
                                 x_step_q4, subpel_y_qn, y_step_q4, conv_params,
                                 bd);
  } else if (conv_params->is_compound) {
    highbd_convolve_2d_facade_compound(
        src, src_stride, dst, dst_stride, w, h, filter_params_x,
        filter_params_y, subpel_x_qn, subpel_y_qn, conv_params, bd);
  } else {
    highbd_convolve_2d_facade_single(src, src_stride, dst, dst_stride, w, h,
                                     filter_params_x, filter_params_y,
                                     subpel_x_qn, subpel_y_qn, conv_params, bd);
  }
}